

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cord.cc
# Opt level: O2

char __thiscall absl::lts_20240722::Cord::operator[](Cord *this,size_t i)

{
  byte bVar1;
  char cVar2;
  size_t sVar3;
  Nullable<absl::cord_internal::CordRep_*> rep;
  CordRep *this_00;
  CordRepSubstring *pCVar4;
  CordRepBtree *pCVar5;
  Nullable<const_char_*> pcVar6;
  CordRepFlat *pCVar7;
  CordRepExternal *pCVar8;
  
  sVar3 = InlineRep::size(&this->contents_);
  if (sVar3 <= i) {
    __assert_fail("false && \"i < size()\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_abseil/build_O2/_deps/absl-src/absl/strings/cord.cc"
                  ,0x485,
                  "auto absl::Cord::operator[](size_t)::(anonymous class)::operator()() const");
  }
  rep = InlineRep::tree(&this->contents_);
  if (rep == (Nullable<absl::cord_internal::CordRep_*>)0x0) {
    pcVar6 = InlineRep::data(&this->contents_);
  }
  else {
    this_00 = cord_internal::SkipCrcNode(rep);
    while( true ) {
      if (this_00 == (CordRep *)0x0) {
        __assert_fail("rep != nullptr",
                      "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_abseil/build_O2/_deps/absl-src/absl/strings/cord.cc"
                      ,0x48d,"char absl::Cord::operator[](size_t) const");
      }
      if (this_00->length <= i) {
        __assert_fail("offset < rep->length",
                      "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_abseil/build_O2/_deps/absl-src/absl/strings/cord.cc"
                      ,0x48e,"char absl::Cord::operator[](size_t) const");
      }
      bVar1 = this_00->tag;
      if (5 < bVar1) {
        pCVar7 = cord_internal::CordRep::flat(this_00);
        return (pCVar7->super_CordRep).storage[i];
      }
      if (bVar1 != 1) break;
      pCVar4 = cord_internal::CordRep::substring(this_00);
      i = i + pCVar4->start;
      pCVar4 = cord_internal::CordRep::substring(this_00);
      this_00 = pCVar4->child;
    }
    if (bVar1 != 5) {
      if (bVar1 != 3) {
        __assert_fail("rep->IsSubstring()",
                      "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_abseil/build_O2/_deps/absl-src/absl/strings/cord.cc"
                      ,0x499,"char absl::Cord::operator[](size_t) const");
      }
      pCVar5 = cord_internal::CordRep::btree(this_00);
      cVar2 = absl::lts_20240722::cord_internal::CordRepBtree::GetCharacter((ulong)pCVar5);
      return cVar2;
    }
    pCVar8 = cord_internal::CordRep::external(this_00);
    pcVar6 = pCVar8->base;
  }
  return pcVar6[i];
}

Assistant:

char Cord::operator[](size_t i) const {
  ABSL_HARDENING_ASSERT(i < size());
  size_t offset = i;
  const CordRep* rep = contents_.tree();
  if (rep == nullptr) {
    return contents_.data()[i];
  }
  rep = cord_internal::SkipCrcNode(rep);
  while (true) {
    assert(rep != nullptr);
    assert(offset < rep->length);
    if (rep->IsFlat()) {
      // Get the "i"th character directly from the flat array.
      return rep->flat()->Data()[offset];
    } else if (rep->IsBtree()) {
      return rep->btree()->GetCharacter(offset);
    } else if (rep->IsExternal()) {
      // Get the "i"th character from the external array.
      return rep->external()->base[offset];
    } else {
      // This must be a substring a node, so bypass it to get to the child.
      assert(rep->IsSubstring());
      offset += rep->substring()->start;
      rep = rep->substring()->child;
    }
  }
}